

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  uv_loop_t *loop;
  int iVar2;
  int extraout_EDX;
  uint uVar3;
  char *pcVar4;
  long *path;
  uv_fs_event_t *puVar5;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_248 [32];
  uv_fs_t uStack_228;
  uv_loop_t *puStack_68;
  long lStack_50;
  char *pcStack_48;
  
  uVar3 = fs_event_cb_called + 1;
  pcVar4 = (char *)(ulong)uVar3;
  fs_event_cb_called = uVar3;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_00184345;
    if (1 < events - 1U) goto LAB_00184352;
    iVar1 = strncmp(filename,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar3 != 0x20) {
        return;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00184345:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00184352:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar4 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_48 = pcVar4;
  loop = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  lStack_50 = (long)iVar1;
  if (lStack_50 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_00184634;
    iVar1 = uv_timer_init(loop,&timer);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_00184641;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_0018464e;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_50 = 1;
    if (fs_event_cb_called != 1) goto LAB_0018465b;
    lStack_50 = 2;
    if (timer_cb_called != 2) goto LAB_00184668;
    lStack_50 = 2;
    if (close_cb_called != 2) goto LAB_00184675;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_50 = 0;
    iVar1 = uv_loop_close(loop);
    if (lStack_50 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00184634:
    run_test_fs_event_watch_file_cold_2();
LAB_00184641:
    run_test_fs_event_watch_file_cold_3();
LAB_0018464e:
    run_test_fs_event_watch_file_cold_4();
LAB_0018465b:
    run_test_fs_event_watch_file_cold_5();
LAB_00184668:
    run_test_fs_event_watch_file_cold_6();
LAB_00184675:
    run_test_fs_event_watch_file_cold_7();
  }
  path = &lStack_50;
  run_test_fs_event_watch_file_cold_8();
  iVar2 = 0x41;
  auStack_248._0_8_ = (void *)0x1846b5;
  puStack_68 = loop;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_248 + 0x20),(char *)path,0x41,0x180,
                     (uv_fs_cb)0x0);
  auStack_248._24_8_ = SEXT48(iVar1);
  auStack_248._16_8_ = 0;
  if ((uv_close_cb)auStack_248._24_8_ == (uv_close_cb)0x0) {
    auStack_248._0_8_ = (void *)0x1846e1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_248 + 0x20));
    iVar2 = 0;
    auStack_248._0_8_ = (void *)0x1846ef;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_248 + 0x20),
                        (uv_os_fd_t)uStack_228.result,(uv_fs_cb)0x0);
    auStack_248._24_8_ = SEXT48(iVar1);
    auStack_248._16_8_ = 0;
    if ((uv_close_cb)auStack_248._24_8_ == (uv_close_cb)0x0) {
      auStack_248._0_8_ = (void *)0x184715;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_248 + 0x20));
      return;
    }
  }
  else {
    auStack_248._0_8_ = (void *)0x18472e;
    create_file_cold_1();
  }
  puVar5 = (uv_fs_event_t *)(auStack_248 + 0x18);
  pcVar4 = auStack_248 + 0x10;
  auStack_248._0_8_ = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar5 == &fs_event) {
    auStack_248._0_8_ = SEXT48(iVar2);
    if ((code *)auStack_248._0_8_ != (code *)0x0) goto LAB_0018480b;
    auStack_248._0_8_ = SEXT48(extraout_EDX);
    if ((code *)auStack_248._0_8_ != (code *)0x2) goto LAB_0018481a;
    iVar1 = strcmp(pcVar4,"file2");
    auStack_248._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_248._0_8_ == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      auStack_248._0_8_ = SEXT48(iVar1);
      if ((code *)auStack_248._0_8_ == (code *)0x0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return;
      }
      goto LAB_00184838;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_0018480b:
    fs_event_cb_file_cold_2();
LAB_0018481a:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00184838:
  handle_00 = (uv_handle_t *)auStack_248;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(handle_00,close_cb);
  return;
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT_PTR_EQ(handle, &fs_event);
  ASSERT_OK(status);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT_OK(strncmp(filename, file_prefix, sizeof(file_prefix) - 1));
  #else
  ASSERT_NE(filename == NULL ||
            strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0, 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}